

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O3

int cvsrch(custom_function *funcpt,custom_gradient *funcgrad,double *x,double *f,double *g,
          double *stp,double *s,int N,double *dx,double maxstep,int MAXITER,double eps2,double ftol,
          double gtol,double xtol)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  ulong uVar5;
  char *__format;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_180;
  double local_178;
  double dgm;
  double fm;
  double local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_130;
  double dgxm;
  double dgym;
  double fxm;
  double fym;
  double local_108;
  double local_100;
  double dgx;
  double dgy;
  double fx;
  double fy;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  int local_9c;
  double local_98;
  double stx;
  double local_88;
  double local_80;
  double sty;
  double *local_70;
  uint local_64;
  double *pdStack_60;
  int brackt;
  double local_58;
  void *local_50;
  int local_44;
  double local_40;
  ulong local_38;
  
  dVar6 = (double)(long)N;
  fm = (double)funcgrad;
  local_160 = eps2;
  fym = (double)funcpt;
  fy = maxstep;
  local_c8 = xtol;
  local_c0 = gtol;
  local_a8 = ftol;
  pdStack_60 = f;
  local_70 = (double *)malloc((long)dVar6 * 8);
  __ptr = malloc((long)dVar6 * 8);
  stx = dVar6;
  if (((((long)dVar6 < 1) || (dVar6 = 0.0, local_c8 < 0.0)) || (local_c0 < 0.0)) ||
     ((local_a8 < 0.0 || (*stp <= 0.0)))) {
    free(local_70);
  }
  else {
    uVar5 = (ulong)(uint)N;
    uVar4 = 0;
    do {
      dVar6 = dVar6 + dx[uVar4] * s[uVar4] * dx[uVar4] * s[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    local_50 = __ptr;
    if (dVar6 < 0.0) {
      sqrt(dVar6);
    }
    uVar4 = 0;
    do {
      dVar6 = ABS(x[uVar4]);
      if (ABS(x[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar6 = 1.0 / ABS(dx[uVar4]);
      }
      local_70[uVar4] = s[uVar4] / dVar6;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    local_d8 = array_max_abs(local_70,SUB84(stx,0));
    local_d8 = local_a8 / local_d8;
    dVar6 = 0.0;
    uVar4 = 0;
    do {
      dVar6 = dVar6 + g[uVar4] * s[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    if (dVar6 < 0.0) {
      local_64 = 0;
      local_108 = *pdStack_60;
      local_158 = dVar6 * local_a8;
      uStack_150 = 0;
      local_88 = fy - local_d8;
      local_d0 = local_88 + local_88;
      memcpy(local_50,x,uVar5 * 8);
      uVar4 = 0;
      local_98 = 0.0;
      dgy = local_108;
      local_80 = 0.0;
      fx = local_108;
      local_9c = MAXITER + -1;
      dVar8 = -dVar6 * local_c0;
      local_44 = 0;
      local_b8 = (double)CONCAT44(local_b8._4_4_,1);
      uVar1 = 1;
      dVar7 = local_88;
      local_100 = dVar6;
      dgx = dVar6;
      do {
        sty = local_98;
        local_148 = (double)CONCAT44(local_148._4_4_,uVar1);
        local_88 = dVar7;
        local_38 = uVar4;
        if ((int)uVar4 == 1) {
          local_40 = local_80;
          local_58 = pmin(local_98,local_80);
          local_40 = pmax(sty,local_40);
          dVar7 = *stp;
        }
        else {
          dVar7 = *stp;
          local_40 = (dVar7 - local_98) * 4.0 + dVar7;
          local_58 = local_98;
        }
        dVar7 = pmax(dVar7,local_d8);
        *stp = dVar7;
        dVar7 = pmin(dVar7,fy);
        *stp = dVar7;
        if ((int)local_38 == 1) {
          if (((dVar7 <= local_58) ||
              (((local_40 <= dVar7 || (local_9c <= local_44)) || (local_b8._0_4_ == 0)))) ||
             (local_40 - local_58 <= local_40 * local_c8)) {
LAB_00142d25:
            *stp = sty;
          }
        }
        else if ((local_9c <= local_44) || (local_b8._0_4_ == 0)) goto LAB_00142d25;
        uVar4 = 0;
        do {
          x[uVar4] = *stp * s[uVar4] + *(double *)((long)local_50 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        dVar7 = (double)(**(code **)fym)(x,stx,*(undefined8 *)((long)fym + 8));
        *pdStack_60 = dVar7;
        if (1.79769313486232e+308 <= ABS(dVar7)) {
          __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00143222:
          printf(__format);
          free(local_70);
          free(local_50);
          return 0xf;
        }
        if (NAN(dVar7)) {
          __format = "Program Exiting as the function returns NaN";
          goto LAB_00143222;
        }
        if (fm == 0.0) {
          grad_calc2((custom_function *)fym,x,SUB84(stx,0),dx,local_160,g);
        }
        else {
          (**(code **)fm)(x,stx,g,*(undefined8 *)((long)fm + 8));
        }
        local_44 = local_44 + 1;
        dVar7 = 0.0;
        uVar4 = 0;
        do {
          dVar7 = dVar7 + g[uVar4] * s[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        dVar9 = *stp;
        if ((((int)local_38 == 1) && ((dVar9 <= local_58 || (local_40 <= dVar9)))) ||
           (local_b8._0_4_ == 0)) {
          uVar1 = 6;
        }
        else {
          uVar1 = 0;
        }
        dVar10 = dVar9 * local_158 + local_108;
        if (((dVar9 == fy) && (!NAN(dVar9) && !NAN(fy))) &&
           (*pdStack_60 <= dVar10 && dVar7 <= local_158)) {
          uVar1 = 5;
        }
        if (((dVar9 == local_d8) && (!NAN(dVar9) && !NAN(local_d8))) &&
           (local_158 <= dVar7 || dVar10 < *pdStack_60)) {
          uVar1 = 4;
        }
        if (MAXITER <= local_44) {
          uVar1 = 3;
        }
        if (((int)local_38 == 1) && (local_40 - local_58 <= local_40 * local_c8)) {
          uVar1 = 2;
        }
        dVar9 = *pdStack_60;
        local_180 = dVar7;
        if (dVar9 <= dVar10) {
          if (ABS(dVar7) <= dVar8) {
            uVar1 = 1;
          }
          uVar2 = 0;
          if (local_148._0_4_ == 1) {
            uStack_140 = 0;
            local_38 = CONCAT44(local_38._4_4_,uVar1);
            uStack_b0 = 0;
            local_148 = dVar10;
            local_b8 = dVar7;
            dVar7 = pmin(local_a8,local_c0);
            uVar1 = (int)local_38;
            if (local_b8 < dVar7 * dVar6) {
              dVar9 = *pdStack_60;
              dVar7 = local_b8;
              dVar10 = local_148;
              goto LAB_00143064;
            }
            uVar2 = 0;
          }
LAB_00142f34:
          sty = (double)CONCAT44(sty._4_4_,uVar2);
          local_38 = CONCAT44(local_38._4_4_,uVar1);
          iVar3 = cstep(&local_98,&dgy,&local_100,&local_80,&fx,&dgx,stp,pdStack_60,&local_180,
                        (int *)&local_64,local_58,local_40);
          local_b8 = (double)CONCAT44(local_b8._4_4_,iVar3);
          uVar1 = sty._0_4_;
        }
        else {
          uVar2 = 0;
          if (local_148._0_4_ != 1) goto LAB_00142f34;
LAB_00143064:
          uVar2 = 1;
          if ((dgy < dVar9) || (dVar9 <= dVar10)) goto LAB_00142f34;
          local_38 = CONCAT44(local_38._4_4_,uVar1);
          dgm = dVar9 - *stp * local_158;
          dgym = dgy - sty * local_158;
          fxm = fx - local_80 * local_158;
          local_178 = dVar7 - local_158;
          local_130 = local_100 - local_158;
          dgxm = dgx - local_158;
          iVar3 = cstep(&local_98,&dgym,&local_130,&local_80,&fxm,&dgxm,stp,&dgm,&local_178,
                        (int *)&local_64,local_58,local_40);
          local_b8 = (double)CONCAT44(local_b8._4_4_,iVar3);
          dgy = local_98 * local_158 + dgym;
          fx = local_80 * local_158 + fxm;
          local_100 = local_130 + local_158;
          dgx = dgxm + local_158;
          uVar1 = 1;
        }
        uVar4 = (ulong)local_64;
        dVar7 = local_88;
        if (local_64 == 1) {
          dVar7 = ABS(local_80 - local_98);
          dVar9 = local_d0 * 0.66;
          local_d0 = local_88;
          if (dVar9 <= dVar7) {
            *stp = (local_80 - local_98) * 0.5 + local_98;
          }
        }
        if ((int)local_38 != 0) {
          free(local_70);
          free(local_50);
          return (int)local_38;
        }
      } while( true );
    }
    free(local_70);
    __ptr = local_50;
  }
  free(__ptr);
  return 0;
}

Assistant:

int cvsrch(custom_function *funcpt, custom_gradient *funcgrad, double *x, double *f, double *g, double *stp, double *s, int N, double *dx, double maxstep,
	int MAXITER,double eps2,double ftol, double gtol, double xtol) {
	int info,i,siter,nfev;
	int infoc, j, brackt, stage1;
	double dg, dgm, dginit, dgtest, dgx, dgxm, dgy, dgym, finit, ftest1, fm, fx, fxm, fy, fym, p5, p66, stx, sty,
		stmin, stmax, width, width1, xtrapf;
	double nlen,den,rell,stepmin;
	double *rcheck,*wa;

	rcheck = (double*)malloc(sizeof(double)*N);
	wa = (double*)malloc(sizeof(double)*N);

	nlen = 0.0;
	p5 = 0.5;
	p66 = 0.66;
	xtrapf = 4.0;
	info = 0;
	infoc = 1;
	siter = MAXITER;


	if (N <= 0 || *stp <= 0.0 || ftol < 0.0 || gtol < 0.0 || xtol < 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}


	for (i = 0; i < N; ++i) {
		nlen += dx[i] * s[i] * dx[i] * s[i];
	}
	nlen = sqrt(nlen);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) > 1.0 / fabs(dx[i])) {
			den = fabs(x[i]);
		}
		else {
			den = 1.0 / fabs(dx[i]);
		}
		rcheck[i] = s[i] / den;
	}

	rell = array_max_abs(rcheck, N);

	stepmin = ftol / rell;

	dginit = 0.0;

	for (j = 0; j < N; ++j) {
		dginit += g[j] * s[j];
	}

	if (dginit >= 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}

	brackt = 0;
	stage1 = 1;
	finit = *f;
	nfev = 0;
	dgtest = ftol*dginit;
	width = maxstep - stepmin;
	width1 = width / 0.5;

	for (j = 0; j < N; ++j) {
		wa[j] = x[j];
	}

	/*     The variables stx, fx, dgx contain the values of the step, 
     function, and directional derivative at the best step.
     The variables sty, fy, dgy contain the value of the step,
     function, and derivative at the other endpoint of
     the interval of uncertainty.
     The variables stp, f, dg contain the values of the step,
     function, and derivative at the current step.
	*/

	stx = 0.0;
	fx = finit;
	dgx = dginit;
	sty = 0.0;
	fy = finit;
	dgy = dginit;

	// Iteration

	while (info == 0) {

		if (brackt == 1) {
			stmin = pmin(stx, sty);
			stmax = pmax(stx, sty);
		} else {
			stmin = stx;
			stmax = *stp + xtrapf*(*stp - stx);
		}

		*stp = pmax(*stp, stepmin);
		*stp = pmin(*stp, maxstep);

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || nfev >= siter - 1 || infoc == 0 || (brackt == 1 && (stmax - stmin) <= xtol*stmax)) {
			*stp = stx;
		}

		for (j = 0; j < N; ++j) {
			x[j] = wa[j] + *stp * s[j];
		}

		*f = FUNCPT_EVAL(funcpt,x, N);
		if (*f >= DBL_MAX || *f <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(rcheck);
			free(wa);
			return 15;
		}
		if (*f != *f) {
			printf("Program Exiting as the function returns NaN");
			free(rcheck);
			free(wa);
			return 15;
		}
		grad_cd(funcpt,funcgrad, x, N, dx, eps2,g);
		nfev++;


		dg = 0.0;
		for (j = 0; j < N; ++j) {
			dg = dg + g[j]*s[j];
		}	
		ftest1 = finit + *stp * dgtest;

		//       Test for convergence.

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || infoc == 0) {
			info = 6;
		}

		if (*stp == maxstep && *f <= ftest1 && dg <= dgtest) {
			info = 5;
		}

		if (*stp == stepmin && (*f > ftest1 || dg >= dgtest)) {
			info = 4;
		}

		if (nfev >= siter) {
			info = 3;
		}

		if (brackt == 1 && ((stmax - stmin) <= xtol*stmax)) {
			info = 2;
		}

		if (*f <= ftest1 && fabs(dg) <= gtol*(-dginit)) {
			info = 1;
		}

		if (stage1 == 1 && *f <= ftest1 && dg >= pmin(ftol, gtol)*dginit) {
			stage1 = 0;
		}


		/*
		A modified function is used to predict the step only if
        we have not obtained a step for which the modified
        function has a nonpositive function value and nonnegative
        derivative, and if a lower function value has been
        obtained but the decrease is not sufficient.
		*/
		if (stage1 == 1 && *f <= fx && *f > ftest1) {

			fm = *f - *stp*dgtest;
			fxm = fx - stx*dgtest;
			fym = fy - sty*dgtest;
			dgm = dg - dgtest;
			dgxm = dgx - dgtest;
			dgym = dgy - dgtest;

			infoc = cstep(&stx, &fxm, &dgxm, &sty, &fym, &dgym, stp, &fm, &dgm, &brackt, stmin, stmax);

			fx = fxm + stx*dgtest;
			fy = fym + sty*dgtest;
			dgx = dgxm + dgtest;
			dgy = dgym + dgtest;
		} else {
			
			infoc = cstep(&stx, &fx, &dgx, &sty, &fy, &dgy, stp, f, &dg, &brackt, stmin, stmax);
		}

		if (brackt == 1) {
			if (fabs(sty - stx) >= p66*width1) {
				*stp = stx + p5*(sty - stx);
			}
			width1 = width;
			width = fabs(sty - stx);
		}

	}

	free(rcheck);
	free(wa);

	return info;
}